

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 (*pauVar48) [16];
  uint uVar49;
  uint uVar50;
  long lVar51;
  uint uVar52;
  undefined4 uVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  undefined1 (*pauVar60) [16];
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  float fVar83;
  undefined1 auVar71 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [32];
  float fVar78;
  float fVar79;
  float fVar82;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar112;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar107;
  undefined1 auVar102 [32];
  float fVar108;
  float fVar111;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar113;
  float fVar114;
  float fVar124;
  float fVar125;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar132;
  float fVar140;
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar145;
  float fVar147;
  float fVar149;
  undefined1 auVar136 [32];
  float fVar143;
  undefined1 auVar137 [32];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar148;
  float fVar150;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar158;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar161 [32];
  float fVar167;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar171;
  undefined1 auVar172 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar173 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar186;
  float fVar187;
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar189 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar204;
  undefined1 auVar205 [32];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [64];
  float fVar213;
  float fVar214;
  undefined1 auVar215 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar216 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar233 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1661;
  ulong local_1660;
  ulong local_1658;
  uint local_1650;
  uint local_164c;
  ulong local_1648;
  undefined1 local_1640 [8];
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined1 *local_1608;
  undefined1 (*local_1600) [16];
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  long local_15c8;
  long local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  undefined1 (*local_1598) [16];
  long local_1590;
  long local_1588;
  Scene *local_1580;
  ulong local_1578;
  RTCFilterFunctionNArguments local_1570;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [16];
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [16];
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  undefined1 local_1200 [8];
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar60 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar53 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13c0._4_4_ = uVar53;
  local_13c0._0_4_ = uVar53;
  local_13c0._8_4_ = uVar53;
  local_13c0._12_4_ = uVar53;
  auVar157 = ZEXT1664(local_13c0);
  uVar53 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13d0._4_4_ = uVar53;
  local_13d0._0_4_ = uVar53;
  local_13d0._8_4_ = uVar53;
  local_13d0._12_4_ = uVar53;
  uVar53 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = uVar53;
  local_1380._0_4_ = uVar53;
  local_1380._8_4_ = uVar53;
  local_1380._12_4_ = uVar53;
  auVar189 = ZEXT1664(local_1380);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar69 = ZEXT416((uint)(fVar66 * 0.99999964));
  local_13e0 = vshufps_avx(auVar69,auVar69,0);
  auVar173 = ZEXT1664(local_13e0);
  auVar69 = ZEXT416((uint)(fVar76 * 0.99999964));
  local_13f0 = vshufps_avx(auVar69,auVar69,0);
  auVar185 = ZEXT1664(local_13f0);
  auVar130 = ZEXT1664(local_13d0);
  auVar69 = ZEXT416((uint)(fVar106 * 0.99999964));
  local_1390 = vshufps_avx(auVar69,auVar69,0);
  auVar216 = ZEXT1664(local_1390);
  auVar69 = ZEXT416((uint)(fVar66 * 1.0000004));
  local_13a0 = vshufps_avx(auVar69,auVar69,0);
  auVar230 = ZEXT1664(local_13a0);
  auVar69 = ZEXT416((uint)(fVar76 * 1.0000004));
  local_13b0 = vshufps_avx(auVar69,auVar69,0);
  auVar233 = ZEXT1664(local_13b0);
  auVar69 = ZEXT416((uint)(fVar106 * 1.0000004));
  local_14b0 = vshufps_avx(auVar69,auVar69,0);
  auVar203 = ZEXT1664(local_14b0);
  local_15a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_15b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_15b8 = local_15a0 ^ 0x10;
  uVar55 = local_15a8 ^ 0x10;
  uVar58 = local_15b0 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_14c0._4_4_ = iVar1;
  local_14c0._0_4_ = iVar1;
  local_14c0._8_4_ = iVar1;
  local_14c0._12_4_ = iVar1;
  auVar206 = ZEXT1664(local_14c0);
  iVar1 = (tray->tfar).field_0.i[k];
  local_14d0._4_4_ = iVar1;
  local_14d0._0_4_ = iVar1;
  local_14d0._8_4_ = iVar1;
  local_14d0._12_4_ = iVar1;
  local_15d0 = local_15a0 >> 2;
  local_11e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_11e0._0_16_ = mm_lookupmask_ps._0_16_;
  uVar52 = 1 << ((byte)k & 0x1f);
  local_1600 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar52 & 0xf) << 4));
  local_1608 = mm_lookupmask_ps + (long)((int)uVar52 >> 4) * 0x10;
  local_15d8 = local_15b8 >> 2;
  local_15e0 = local_15a8 >> 2;
  local_15e8 = uVar55 >> 2;
  local_15f0 = local_15b0 >> 2;
  local_15f8 = uVar58 >> 2;
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar71._8_4_ = 0xbf800000;
  auVar71._0_8_ = 0xbf800000bf800000;
  auVar71._12_4_ = 0xbf800000;
  auVar71._16_4_ = 0xbf800000;
  auVar71._20_4_ = 0xbf800000;
  auVar71._24_4_ = 0xbf800000;
  auVar71._28_4_ = 0xbf800000;
  _local_1200 = vblendvps_avx(auVar100,auVar71,local_11e0);
  local_1658 = uVar55;
  local_1660 = uVar58;
  uVar63 = local_15b8;
  uVar62 = local_15b0;
  uVar61 = local_15a8;
  uVar57 = local_15a0;
LAB_00faa40b:
  do {
    do {
      if (pauVar60 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar48 = pauVar60 + -1;
      pauVar60 = pauVar60 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar48 + 8));
    uVar65 = *(ulong *)*pauVar60;
    while ((uVar65 & 8) == 0) {
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar57),auVar157._0_16_);
      auVar67._0_4_ = auVar173._0_4_ * auVar69._0_4_;
      auVar67._4_4_ = auVar173._4_4_ * auVar69._4_4_;
      auVar67._8_4_ = auVar173._8_4_ * auVar69._8_4_;
      auVar67._12_4_ = auVar173._12_4_ * auVar69._12_4_;
      auVar68 = auVar130._0_16_;
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar61),auVar68);
      auVar84._0_4_ = auVar185._0_4_ * auVar69._0_4_;
      auVar84._4_4_ = auVar185._4_4_ * auVar69._4_4_;
      auVar84._8_4_ = auVar185._8_4_ * auVar69._8_4_;
      auVar84._12_4_ = auVar185._12_4_ * auVar69._12_4_;
      auVar69 = vmaxps_avx(auVar67,auVar84);
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar62),auVar189._0_16_);
      auVar85._0_4_ = auVar216._0_4_ * auVar67._0_4_;
      auVar85._4_4_ = auVar216._4_4_ * auVar67._4_4_;
      auVar85._8_4_ = auVar216._8_4_ * auVar67._8_4_;
      auVar85._12_4_ = auVar216._12_4_ * auVar67._12_4_;
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar63),auVar157._0_16_);
      auVar95._0_4_ = auVar230._0_4_ * auVar67._0_4_;
      auVar95._4_4_ = auVar230._4_4_ * auVar67._4_4_;
      auVar95._8_4_ = auVar230._8_4_ * auVar67._8_4_;
      auVar95._12_4_ = auVar230._12_4_ * auVar67._12_4_;
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar55),auVar68);
      auVar115._0_4_ = auVar233._0_4_ * auVar67._0_4_;
      auVar115._4_4_ = auVar233._4_4_ * auVar67._4_4_;
      auVar115._8_4_ = auVar233._8_4_ * auVar67._8_4_;
      auVar115._12_4_ = auVar233._12_4_ * auVar67._12_4_;
      auVar84 = vminps_avx(auVar95,auVar115);
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar58),auVar189._0_16_);
      auVar116._0_4_ = auVar203._0_4_ * auVar67._0_4_;
      auVar116._4_4_ = auVar203._4_4_ * auVar67._4_4_;
      auVar116._8_4_ = auVar203._8_4_ * auVar67._8_4_;
      auVar116._12_4_ = auVar203._12_4_ * auVar67._12_4_;
      auVar67 = vmaxps_avx(auVar85,auVar206._0_16_);
      auVar67 = vmaxps_avx(auVar69,auVar67);
      auVar69 = vminps_avx(auVar116,local_14d0);
      auVar69 = vminps_avx(auVar84,auVar69);
      auVar69 = vcmpps_avx(auVar67,auVar69,2);
      uVar52 = vmovmskps_avx(auVar69);
      local_1360._0_16_ = auVar67;
      if (uVar52 == 0) goto LAB_00faa40b;
      uVar52 = uVar52 & 0xff;
      uVar64 = uVar65 & 0xfffffffffffffff0;
      lVar51 = 0;
      if (uVar52 != 0) {
        for (; (uVar52 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
        }
      }
      uVar65 = *(ulong *)(uVar64 + lVar51 * 8);
      uVar52 = uVar52 - 1 & uVar52;
      if (uVar52 != 0) {
        uVar50 = *(uint *)(local_1360 + lVar51 * 4);
        lVar51 = 0;
        if (uVar52 != 0) {
          for (; (uVar52 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
          }
        }
        uVar6 = *(ulong *)(uVar64 + lVar51 * 8);
        uVar5 = *(uint *)(local_1360 + lVar51 * 4);
        uVar52 = uVar52 - 1 & uVar52;
        uVar55 = local_1658;
        uVar58 = local_1660;
        if (uVar52 == 0) {
          if (uVar50 < uVar5) {
            *(ulong *)*pauVar60 = uVar6;
            *(uint *)(*pauVar60 + 8) = uVar5;
            pauVar60 = pauVar60 + 1;
          }
          else {
            *(ulong *)*pauVar60 = uVar65;
            *(uint *)(*pauVar60 + 8) = uVar50;
            pauVar60 = pauVar60 + 1;
            uVar65 = uVar6;
          }
        }
        else {
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uVar65;
          auVar69 = vpunpcklqdq_avx(auVar69,ZEXT416(uVar50));
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar6;
          auVar67 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar5));
          lVar51 = 0;
          if (uVar52 != 0) {
            for (; (uVar52 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
            }
          }
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(uVar64 + lVar51 * 8);
          auVar85 = vpunpcklqdq_avx(auVar96,ZEXT416(*(uint *)(local_1360 + lVar51 * 4)));
          auVar84 = vpcmpgtd_avx(auVar67,auVar69);
          uVar52 = uVar52 - 1 & uVar52;
          if (uVar52 == 0) {
            auVar95 = vpshufd_avx(auVar84,0xaa);
            auVar84 = vblendvps_avx(auVar67,auVar69,auVar95);
            auVar69 = vblendvps_avx(auVar69,auVar67,auVar95);
            auVar67 = vpcmpgtd_avx(auVar85,auVar84);
            auVar95 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar85,auVar84,auVar95);
            auVar84 = vblendvps_avx(auVar84,auVar85,auVar95);
            auVar85 = vpcmpgtd_avx(auVar84,auVar69);
            auVar95 = vpshufd_avx(auVar85,0xaa);
            auVar85 = vblendvps_avx(auVar84,auVar69,auVar95);
            auVar69 = vblendvps_avx(auVar69,auVar84,auVar95);
            *pauVar60 = auVar69;
            pauVar60[1] = auVar85;
            uVar65 = auVar67._0_8_;
            pauVar60 = pauVar60 + 2;
          }
          else {
            lVar51 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
              }
            }
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)(uVar64 + lVar51 * 8);
            auVar115 = vpunpcklqdq_avx(auVar126,ZEXT416(*(uint *)(local_1360 + lVar51 * 4)));
            auVar95 = vpshufd_avx(auVar84,0xaa);
            auVar84 = vblendvps_avx(auVar67,auVar69,auVar95);
            auVar69 = vblendvps_avx(auVar69,auVar67,auVar95);
            auVar67 = vpcmpgtd_avx(auVar115,auVar85);
            auVar95 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar115,auVar85,auVar95);
            auVar85 = vblendvps_avx(auVar85,auVar115,auVar95);
            auVar95 = vpcmpgtd_avx(auVar85,auVar69);
            auVar115 = vpshufd_avx(auVar95,0xaa);
            auVar95 = vblendvps_avx(auVar85,auVar69,auVar115);
            auVar69 = vblendvps_avx(auVar69,auVar85,auVar115);
            auVar85 = vpcmpgtd_avx(auVar67,auVar84);
            auVar115 = vpshufd_avx(auVar85,0xaa);
            auVar85 = vblendvps_avx(auVar67,auVar84,auVar115);
            auVar67 = vblendvps_avx(auVar84,auVar67,auVar115);
            auVar84 = vpcmpgtd_avx(auVar95,auVar67);
            auVar115 = vpshufd_avx(auVar84,0xaa);
            auVar84 = vblendvps_avx(auVar95,auVar67,auVar115);
            auVar67 = vblendvps_avx(auVar67,auVar95,auVar115);
            *pauVar60 = auVar69;
            pauVar60[1] = auVar67;
            pauVar60[2] = auVar84;
            uVar65 = auVar85._0_8_;
            pauVar60 = pauVar60 + 3;
          }
          auVar130 = ZEXT1664(auVar68);
        }
      }
    }
    local_15c8 = (ulong)((uint)uVar65 & 0xf) - 8;
    uVar65 = uVar65 & 0xfffffffffffffff0;
    local_1598 = pauVar60;
    for (local_15c0 = 0; local_15c0 != local_15c8; local_15c0 = local_15c0 + 1) {
      lVar51 = local_15c0 * 0x58;
      local_1590 = uVar65 + lVar51;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)(uVar65 + 0x20 + lVar51);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)(uVar65 + 0x24 + lVar51);
      auVar69 = vpminub_avx(auVar68,auVar87);
      auVar85 = vpcmpeqb_avx(auVar68,auVar69);
      fVar66 = *(float *)(uVar65 + 0x38 + lVar51);
      fVar76 = *(float *)(uVar65 + 0x44 + lVar51);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = *(ulong *)(local_15d0 + 0x20 + local_1590);
      auVar69 = vpmovzxbd_avx(auVar117);
      auVar69 = vcvtdq2ps_avx(auVar69);
      auVar118._0_4_ = fVar66 + fVar76 * auVar69._0_4_;
      auVar118._4_4_ = fVar66 + fVar76 * auVar69._4_4_;
      auVar118._8_4_ = fVar66 + fVar76 * auVar69._8_4_;
      auVar118._12_4_ = fVar66 + fVar76 * auVar69._12_4_;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = *(ulong *)(local_15d8 + 0x20 + local_1590);
      auVar69 = vpmovzxbd_avx(auVar127);
      auVar69 = vcvtdq2ps_avx(auVar69);
      auVar88._0_4_ = fVar66 + fVar76 * auVar69._0_4_;
      auVar88._4_4_ = fVar66 + fVar76 * auVar69._4_4_;
      auVar88._8_4_ = fVar66 + fVar76 * auVar69._8_4_;
      auVar88._12_4_ = fVar66 + fVar76 * auVar69._12_4_;
      fVar66 = *(float *)(uVar65 + 0x3c + lVar51);
      fVar76 = *(float *)(uVar65 + 0x48 + lVar51);
      auVar133._8_8_ = 0;
      auVar133._0_8_ = *(ulong *)(local_15e0 + 0x20 + local_1590);
      auVar69 = vpmovzxbd_avx(auVar133);
      auVar69 = vcvtdq2ps_avx(auVar69);
      auVar134._0_4_ = fVar66 + fVar76 * auVar69._0_4_;
      auVar134._4_4_ = fVar66 + fVar76 * auVar69._4_4_;
      auVar134._8_4_ = fVar66 + fVar76 * auVar69._8_4_;
      auVar134._12_4_ = fVar66 + fVar76 * auVar69._12_4_;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = *(ulong *)(local_15e8 + 0x20 + local_1590);
      auVar69 = vpmovzxbd_avx(auVar151);
      auVar69 = vcvtdq2ps_avx(auVar69);
      auVar97._0_4_ = fVar66 + fVar76 * auVar69._0_4_;
      auVar97._4_4_ = fVar66 + fVar76 * auVar69._4_4_;
      auVar97._8_4_ = fVar66 + fVar76 * auVar69._8_4_;
      auVar97._12_4_ = fVar66 + fVar76 * auVar69._12_4_;
      fVar66 = *(float *)(uVar65 + 0x4c + lVar51);
      auVar152._8_8_ = 0;
      auVar152._0_8_ = *(ulong *)(local_15f0 + 0x20 + local_1590);
      auVar69 = vpmovzxbd_avx(auVar152);
      auVar69 = vcvtdq2ps_avx(auVar69);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = *(ulong *)(local_15f8 + 0x20 + local_1590);
      auVar67 = vpmovzxbd_avx(auVar159);
      auVar67 = vcvtdq2ps_avx(auVar67);
      fVar76 = *(float *)(uVar65 + 0x40 + lVar51);
      auVar153._0_4_ = fVar76 + fVar66 * auVar69._0_4_;
      auVar153._4_4_ = fVar76 + fVar66 * auVar69._4_4_;
      auVar153._8_4_ = fVar76 + fVar66 * auVar69._8_4_;
      auVar153._12_4_ = fVar76 + fVar66 * auVar69._12_4_;
      auVar128._0_4_ = fVar76 + fVar66 * auVar67._0_4_;
      auVar128._4_4_ = fVar76 + fVar66 * auVar67._4_4_;
      auVar128._8_4_ = fVar76 + fVar66 * auVar67._8_4_;
      auVar128._12_4_ = fVar76 + fVar66 * auVar67._12_4_;
      auVar69 = vsubps_avx(auVar118,auVar157._0_16_);
      auVar119._0_4_ = auVar173._0_4_ * auVar69._0_4_;
      auVar119._4_4_ = auVar173._4_4_ * auVar69._4_4_;
      auVar119._8_4_ = auVar173._8_4_ * auVar69._8_4_;
      auVar119._12_4_ = auVar173._12_4_ * auVar69._12_4_;
      auVar203 = ZEXT1664(local_14b0);
      auVar69 = vsubps_avx(auVar134,auVar130._0_16_);
      auVar135._0_4_ = auVar185._0_4_ * auVar69._0_4_;
      auVar135._4_4_ = auVar185._4_4_ * auVar69._4_4_;
      auVar135._8_4_ = auVar185._8_4_ * auVar69._8_4_;
      auVar135._12_4_ = auVar185._12_4_ * auVar69._12_4_;
      auVar206 = ZEXT1664(local_14c0);
      auVar69 = vmaxps_avx(auVar119,auVar135);
      auVar67 = vsubps_avx(auVar88,auVar157._0_16_);
      auVar89._0_4_ = auVar230._0_4_ * auVar67._0_4_;
      auVar89._4_4_ = auVar230._4_4_ * auVar67._4_4_;
      auVar89._8_4_ = auVar230._8_4_ * auVar67._8_4_;
      auVar89._12_4_ = auVar230._12_4_ * auVar67._12_4_;
      auVar67 = vsubps_avx(auVar97,auVar130._0_16_);
      auVar98._0_4_ = auVar233._0_4_ * auVar67._0_4_;
      auVar98._4_4_ = auVar233._4_4_ * auVar67._4_4_;
      auVar98._8_4_ = auVar233._8_4_ * auVar67._8_4_;
      auVar98._12_4_ = auVar233._12_4_ * auVar67._12_4_;
      auVar84 = vminps_avx(auVar89,auVar98);
      auVar67 = vsubps_avx(auVar153,auVar189._0_16_);
      auVar99._0_4_ = auVar216._0_4_ * auVar67._0_4_;
      auVar99._4_4_ = auVar216._4_4_ * auVar67._4_4_;
      auVar99._8_4_ = auVar216._8_4_ * auVar67._8_4_;
      auVar99._12_4_ = auVar216._12_4_ * auVar67._12_4_;
      auVar67 = vmaxps_avx(auVar99,local_14c0);
      local_1370 = vmaxps_avx(auVar69,auVar67);
      auVar69 = vsubps_avx(auVar128,auVar189._0_16_);
      auVar120._0_4_ = local_14b0._0_4_ * auVar69._0_4_;
      auVar120._4_4_ = local_14b0._4_4_ * auVar69._4_4_;
      auVar120._8_4_ = local_14b0._8_4_ * auVar69._8_4_;
      auVar120._12_4_ = local_14b0._12_4_ * auVar69._12_4_;
      auVar69 = vminps_avx(auVar120,local_14d0);
      auVar69 = vminps_avx(auVar84,auVar69);
      auVar67 = vpmovzxbd_avx(auVar85 ^ _DAT_01f46b70);
      auVar69 = vcmpps_avx(local_1370,auVar69,2);
      auVar69 = vpandn_avx(auVar67,auVar69);
      auVar69 = vpslld_avx(auVar69,0x1f);
      uVar53 = vmovmskps_avx(auVar69);
      local_1578 = CONCAT44((int)((ulong)local_1590 >> 0x20),uVar53);
      while (local_1578 != 0) {
        lVar51 = 0;
        if (local_1578 != 0) {
          for (; (local_1578 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
          }
        }
        local_1578 = local_1578 - 1 & local_1578;
        if (*(float *)(local_1370 + lVar51 * 4) <= *(float *)(ray + k * 4 + 0x100)) {
          uVar3 = *(ushort *)(local_1590 + lVar51 * 8);
          uVar4 = *(ushort *)(local_1590 + 2 + lVar51 * 8);
          uVar52 = *(uint *)(local_1590 + 0x50);
          uVar50 = *(uint *)(local_1590 + 4 + lVar51 * 8);
          local_1648 = (ulong)uVar50;
          local_1580 = context->scene;
          pGVar7 = (local_1580->geometries).items[uVar52].ptr;
          local_1588 = *(long *)&pGVar7->field_0x58;
          lVar59 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   local_1648;
          local_164c = uVar3 & 0x7fff;
          local_1650 = uVar4 & 0x7fff;
          uVar5 = *(uint *)(local_1588 + 4 + lVar59);
          uVar57 = (ulong)uVar5;
          uVar58 = (ulong)(uVar5 * local_1650 + *(int *)(local_1588 + lVar59) + local_164c);
          lVar51 = *(long *)&pGVar7[1].time_range.upper;
          p_Var8 = pGVar7[1].intersectionFilterN;
          auVar69 = *(undefined1 (*) [16])(lVar51 + (long)p_Var8 * uVar58);
          auVar67 = *(undefined1 (*) [16])(lVar51 + (uVar58 + 1) * (long)p_Var8);
          auVar84 = *(undefined1 (*) [16])(lVar51 + (uVar58 + uVar57) * (long)p_Var8);
          lVar54 = uVar58 + uVar57 + 1;
          auVar85 = *(undefined1 (*) [16])(lVar51 + lVar54 * (long)p_Var8);
          uVar55 = (ulong)(-1 < (short)uVar3);
          auVar95 = *(undefined1 (*) [16])(lVar51 + (uVar58 + uVar55 + 1) * (long)p_Var8);
          lVar56 = uVar55 + lVar54;
          auVar115 = *(undefined1 (*) [16])(lVar51 + lVar56 * (long)p_Var8);
          uVar55 = 0;
          if (-1 < (short)uVar4) {
            uVar55 = uVar57;
          }
          auVar116 = *(undefined1 (*) [16])(lVar51 + (uVar58 + uVar57 + uVar55) * (long)p_Var8);
          auVar68 = *(undefined1 (*) [16])(lVar51 + (lVar54 + uVar55) * (long)p_Var8);
          auVar86 = *(undefined1 (*) [16])(lVar51 + (uVar55 + lVar56) * (long)p_Var8);
          auVar126 = vunpcklps_avx(auVar69,auVar85);
          auVar69 = vunpckhps_avx(auVar69,auVar85);
          auVar87 = vunpcklps_avx(auVar67,auVar84);
          auVar96 = vunpckhps_avx(auVar67,auVar84);
          auVar96 = vunpcklps_avx(auVar69,auVar96);
          auVar88 = vunpcklps_avx(auVar126,auVar87);
          auVar69 = vunpckhps_avx(auVar126,auVar87);
          auVar126 = vunpcklps_avx(auVar67,auVar115);
          auVar67 = vunpckhps_avx(auVar67,auVar115);
          auVar87 = vunpcklps_avx(auVar95,auVar85);
          auVar95 = vunpckhps_avx(auVar95,auVar85);
          auVar89 = vunpcklps_avx(auVar67,auVar95);
          auVar97 = vunpcklps_avx(auVar126,auVar87);
          auVar67 = vunpckhps_avx(auVar126,auVar87);
          auVar126 = vunpcklps_avx(auVar85,auVar86);
          auVar95 = vunpckhps_avx(auVar85,auVar86);
          auVar86 = vunpcklps_avx(auVar115,auVar68);
          auVar115 = vunpckhps_avx(auVar115,auVar68);
          auVar115 = vunpcklps_avx(auVar95,auVar115);
          auVar87 = vunpcklps_avx(auVar126,auVar86);
          auVar95 = vunpckhps_avx(auVar126,auVar86);
          auVar86 = vunpcklps_avx(auVar84,auVar68);
          auVar84 = vunpckhps_avx(auVar84,auVar68);
          auVar68 = vunpcklps_avx(auVar85,auVar116);
          auVar85 = vunpckhps_avx(auVar85,auVar116);
          auVar85 = vunpcklps_avx(auVar84,auVar85);
          auVar116 = vunpcklps_avx(auVar86,auVar68);
          auVar84 = vunpckhps_avx(auVar86,auVar68);
          auVar161._16_16_ = auVar87;
          auVar161._0_16_ = auVar88;
          auVar172._16_16_ = auVar95;
          auVar172._0_16_ = auVar69;
          auVar122._16_16_ = auVar115;
          auVar122._0_16_ = auVar96;
          auVar129._16_16_ = auVar97;
          auVar129._0_16_ = auVar97;
          auVar136._16_16_ = auVar67;
          auVar136._0_16_ = auVar67;
          auVar184._16_16_ = auVar89;
          auVar184._0_16_ = auVar89;
          auVar188._16_16_ = auVar116;
          auVar188._0_16_ = auVar116;
          auVar202._16_16_ = auVar84;
          auVar202._0_16_ = auVar84;
          auVar72._16_16_ = auVar85;
          auVar72._0_16_ = auVar85;
          uVar53 = *(undefined4 *)(ray + k * 4);
          auVar205._4_4_ = uVar53;
          auVar205._0_4_ = uVar53;
          auVar205._8_4_ = uVar53;
          auVar205._12_4_ = uVar53;
          auVar205._16_4_ = uVar53;
          auVar205._20_4_ = uVar53;
          auVar205._24_4_ = uVar53;
          auVar205._28_4_ = uVar53;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar215._4_4_ = uVar53;
          auVar215._0_4_ = uVar53;
          auVar215._8_4_ = uVar53;
          auVar215._12_4_ = uVar53;
          auVar215._16_4_ = uVar53;
          auVar215._20_4_ = uVar53;
          auVar215._24_4_ = uVar53;
          auVar215._28_4_ = uVar53;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar229._4_4_ = uVar53;
          auVar229._0_4_ = uVar53;
          auVar229._8_4_ = uVar53;
          auVar229._12_4_ = uVar53;
          auVar229._16_4_ = uVar53;
          auVar229._20_4_ = uVar53;
          auVar229._24_4_ = uVar53;
          auVar229._28_4_ = uVar53;
          auVar161 = vsubps_avx(auVar161,auVar205);
          auVar71 = vsubps_avx(auVar172,auVar215);
          auVar100 = vsubps_avx(auVar122,auVar229);
          auVar13 = vsubps_avx(auVar129,auVar205);
          auVar122 = vsubps_avx(auVar136,auVar215);
          auVar14 = vsubps_avx(auVar184,auVar229);
          auVar15 = vsubps_avx(auVar188,auVar205);
          auVar101 = vsubps_avx(auVar202,auVar215);
          auVar16 = vsubps_avx(auVar72,auVar229);
          local_10e0 = vsubps_avx(auVar15,auVar161);
          local_1100 = vsubps_avx(auVar101,auVar71);
          local_1120 = vsubps_avx(auVar16,auVar100);
          fVar106 = auVar71._0_4_;
          fVar66 = auVar101._0_4_ + fVar106;
          fVar109 = auVar71._4_4_;
          fVar76 = auVar101._4_4_ + fVar109;
          fVar112 = auVar71._8_4_;
          fVar77 = auVar101._8_4_ + fVar112;
          fVar144 = auVar71._12_4_;
          fVar78 = auVar101._12_4_ + fVar144;
          fVar148 = auVar71._16_4_;
          fVar80 = auVar101._16_4_ + fVar148;
          fVar9 = auVar71._20_4_;
          fVar81 = auVar101._20_4_ + fVar9;
          fVar11 = auVar71._24_4_;
          fVar83 = auVar101._24_4_ + fVar11;
          fVar132 = auVar71._28_4_;
          fVar231 = auVar100._0_4_;
          fVar158 = fVar231 + auVar16._0_4_;
          fVar234 = auVar100._4_4_;
          fVar165 = fVar234 + auVar16._4_4_;
          fVar236 = auVar100._8_4_;
          fVar166 = fVar236 + auVar16._8_4_;
          fVar238 = auVar100._12_4_;
          fVar167 = fVar238 + auVar16._12_4_;
          fVar240 = auVar100._16_4_;
          fVar168 = fVar240 + auVar16._16_4_;
          fVar242 = auVar100._20_4_;
          fVar169 = fVar242 + auVar16._20_4_;
          fVar244 = auVar100._24_4_;
          fVar170 = fVar244 + auVar16._24_4_;
          fVar113 = auVar100._28_4_;
          fVar79 = local_1120._0_4_;
          fVar82 = local_1120._4_4_;
          auVar17._4_4_ = fVar76 * fVar82;
          auVar17._0_4_ = fVar66 * fVar79;
          fVar105 = local_1120._8_4_;
          auVar17._8_4_ = fVar77 * fVar105;
          fVar107 = local_1120._12_4_;
          auVar17._12_4_ = fVar78 * fVar107;
          fVar110 = local_1120._16_4_;
          auVar17._16_4_ = fVar80 * fVar110;
          fVar114 = local_1120._20_4_;
          auVar17._20_4_ = fVar81 * fVar114;
          fVar125 = local_1120._24_4_;
          auVar17._24_4_ = fVar83 * fVar125;
          auVar17._28_4_ = auVar95._12_4_;
          fVar213 = local_1100._0_4_;
          fVar217 = local_1100._4_4_;
          auVar18._4_4_ = fVar217 * fVar165;
          auVar18._0_4_ = fVar213 * fVar158;
          fVar219 = local_1100._8_4_;
          auVar18._8_4_ = fVar219 * fVar166;
          fVar221 = local_1100._12_4_;
          auVar18._12_4_ = fVar221 * fVar167;
          fVar223 = local_1100._16_4_;
          auVar18._16_4_ = fVar223 * fVar168;
          fVar225 = local_1100._20_4_;
          auVar18._20_4_ = fVar225 * fVar169;
          fVar227 = local_1100._24_4_;
          auVar18._24_4_ = fVar227 * fVar170;
          auVar18._28_4_ = auVar116._12_4_;
          auVar17 = vsubps_avx(auVar18,auVar17);
          fVar108 = auVar161._0_4_;
          fVar186 = auVar15._0_4_ + fVar108;
          fVar111 = auVar161._4_4_;
          fVar190 = auVar15._4_4_ + fVar111;
          fVar142 = auVar161._8_4_;
          fVar192 = auVar15._8_4_ + fVar142;
          fVar146 = auVar161._12_4_;
          fVar194 = auVar15._12_4_ + fVar146;
          fVar150 = auVar161._16_4_;
          fVar196 = auVar15._16_4_ + fVar150;
          fVar10 = auVar161._20_4_;
          fVar198 = auVar15._20_4_ + fVar10;
          fVar12 = auVar161._24_4_;
          fVar200 = auVar15._24_4_ + fVar12;
          fVar204 = local_10e0._0_4_;
          fVar207 = local_10e0._4_4_;
          auVar19._4_4_ = fVar207 * fVar165;
          auVar19._0_4_ = fVar204 * fVar158;
          fVar208 = local_10e0._8_4_;
          auVar19._8_4_ = fVar208 * fVar166;
          fVar209 = local_10e0._12_4_;
          auVar19._12_4_ = fVar209 * fVar167;
          fVar210 = local_10e0._16_4_;
          auVar19._16_4_ = fVar210 * fVar168;
          fVar211 = local_10e0._20_4_;
          auVar19._20_4_ = fVar211 * fVar169;
          fVar212 = local_10e0._24_4_;
          auVar19._24_4_ = fVar212 * fVar170;
          auVar19._28_4_ = fVar113 + auVar16._28_4_;
          auVar72 = local_1120;
          auVar20._4_4_ = fVar190 * fVar82;
          auVar20._0_4_ = fVar186 * fVar79;
          auVar20._8_4_ = fVar192 * fVar105;
          auVar20._12_4_ = fVar194 * fVar107;
          auVar20._16_4_ = fVar196 * fVar110;
          auVar20._20_4_ = fVar198 * fVar114;
          auVar20._24_4_ = fVar200 * fVar125;
          auVar20._28_4_ = auVar84._12_4_;
          auVar18 = vsubps_avx(auVar20,auVar19);
          auVar21._4_4_ = fVar190 * fVar217;
          auVar21._0_4_ = fVar186 * fVar213;
          auVar21._8_4_ = fVar192 * fVar219;
          auVar21._12_4_ = fVar194 * fVar221;
          auVar21._16_4_ = fVar196 * fVar223;
          auVar21._20_4_ = fVar198 * fVar225;
          auVar21._24_4_ = fVar200 * fVar227;
          auVar21._28_4_ = auVar15._28_4_ + auVar161._28_4_;
          auVar20 = local_10e0;
          auVar22._4_4_ = fVar207 * fVar76;
          auVar22._0_4_ = fVar204 * fVar66;
          auVar22._8_4_ = fVar208 * fVar77;
          auVar22._12_4_ = fVar209 * fVar78;
          auVar22._16_4_ = fVar210 * fVar80;
          auVar22._20_4_ = fVar211 * fVar81;
          auVar22._24_4_ = fVar212 * fVar83;
          auVar22._28_4_ = auVar101._28_4_ + fVar132;
          auVar19 = vsubps_avx(auVar22,auVar21);
          local_1640._4_4_ = *(undefined4 *)(ray + k * 4 + 0xa0);
          fVar66 = *(float *)(ray + k * 4 + 0xc0);
          fVar76 = *(float *)(ray + k * 4 + 0x80);
          local_1180._0_4_ =
               fVar76 * auVar17._0_4_ +
               auVar19._0_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._0_4_;
          local_1180._4_4_ =
               fVar76 * auVar17._4_4_ +
               auVar19._4_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._4_4_;
          local_1180._8_4_ =
               fVar76 * auVar17._8_4_ +
               auVar19._8_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._8_4_;
          local_1180._12_4_ =
               fVar76 * auVar17._12_4_ +
               auVar19._12_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._12_4_;
          local_1180._16_4_ =
               fVar76 * auVar17._16_4_ +
               auVar19._16_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._16_4_;
          local_1180._20_4_ =
               fVar76 * auVar17._20_4_ +
               auVar19._20_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._20_4_;
          local_1180._24_4_ =
               fVar76 * auVar17._24_4_ +
               auVar19._24_4_ * fVar66 + (float)local_1640._4_4_ * auVar18._24_4_;
          local_1180._28_4_ = auVar18._28_4_ + auVar19._28_4_ + auVar18._28_4_;
          auVar17 = vsubps_avx(auVar71,auVar122);
          local_1140 = vsubps_avx(auVar100,auVar14);
          fVar168 = fVar106 + auVar122._0_4_;
          fVar169 = fVar109 + auVar122._4_4_;
          fVar170 = fVar112 + auVar122._8_4_;
          fVar186 = fVar144 + auVar122._12_4_;
          fVar190 = fVar148 + auVar122._16_4_;
          fVar192 = fVar9 + auVar122._20_4_;
          fVar194 = fVar11 + auVar122._24_4_;
          fVar77 = auVar122._28_4_;
          fVar196 = fVar231 + auVar14._0_4_;
          fVar198 = fVar234 + auVar14._4_4_;
          fVar200 = fVar236 + auVar14._8_4_;
          fVar176 = fVar238 + auVar14._12_4_;
          fVar178 = fVar240 + auVar14._16_4_;
          fVar180 = fVar242 + auVar14._20_4_;
          fVar182 = fVar244 + auVar14._24_4_;
          fVar78 = auVar14._28_4_;
          fVar214 = local_1140._0_4_;
          fVar218 = local_1140._4_4_;
          auVar23._4_4_ = fVar218 * fVar169;
          auVar23._0_4_ = fVar214 * fVar168;
          fVar220 = local_1140._8_4_;
          auVar23._8_4_ = fVar220 * fVar170;
          fVar222 = local_1140._12_4_;
          auVar23._12_4_ = fVar222 * fVar186;
          fVar224 = local_1140._16_4_;
          auVar23._16_4_ = fVar224 * fVar190;
          fVar226 = local_1140._20_4_;
          auVar23._20_4_ = fVar226 * fVar192;
          fVar228 = local_1140._24_4_;
          auVar23._24_4_ = fVar228 * fVar194;
          auVar23._28_4_ = fVar113;
          fVar80 = auVar17._0_4_;
          fVar81 = auVar17._4_4_;
          auVar24._4_4_ = fVar198 * fVar81;
          auVar24._0_4_ = fVar196 * fVar80;
          fVar83 = auVar17._8_4_;
          auVar24._8_4_ = fVar200 * fVar83;
          fVar158 = auVar17._12_4_;
          auVar24._12_4_ = fVar176 * fVar158;
          fVar165 = auVar17._16_4_;
          auVar24._16_4_ = fVar178 * fVar165;
          fVar166 = auVar17._20_4_;
          auVar24._20_4_ = fVar180 * fVar166;
          fVar167 = auVar17._24_4_;
          auVar24._24_4_ = fVar182 * fVar167;
          auVar24._28_4_ = fVar132;
          auVar71 = vsubps_avx(auVar24,auVar23);
          auVar18 = vsubps_avx(auVar161,auVar13);
          fVar232 = auVar18._0_4_;
          fVar235 = auVar18._4_4_;
          auVar25._4_4_ = fVar235 * fVar198;
          auVar25._0_4_ = fVar232 * fVar196;
          fVar237 = auVar18._8_4_;
          auVar25._8_4_ = fVar237 * fVar200;
          fVar239 = auVar18._12_4_;
          auVar25._12_4_ = fVar239 * fVar176;
          fVar241 = auVar18._16_4_;
          auVar25._16_4_ = fVar241 * fVar178;
          fVar243 = auVar18._20_4_;
          auVar25._20_4_ = fVar243 * fVar180;
          fVar245 = auVar18._24_4_;
          auVar25._24_4_ = fVar245 * fVar182;
          auVar25._28_4_ = fVar113 + fVar78;
          fVar196 = fVar108 + auVar13._0_4_;
          fVar198 = fVar111 + auVar13._4_4_;
          fVar200 = fVar142 + auVar13._8_4_;
          fVar176 = fVar146 + auVar13._12_4_;
          fVar178 = fVar150 + auVar13._16_4_;
          fVar180 = fVar10 + auVar13._20_4_;
          fVar182 = fVar12 + auVar13._24_4_;
          auVar26._4_4_ = fVar198 * fVar218;
          auVar26._0_4_ = fVar196 * fVar214;
          auVar26._8_4_ = fVar200 * fVar220;
          auVar26._12_4_ = fVar176 * fVar222;
          auVar26._16_4_ = fVar178 * fVar224;
          auVar26._20_4_ = fVar180 * fVar226;
          auVar26._24_4_ = fVar182 * fVar228;
          auVar26._28_4_ = local_1140._28_4_;
          auVar100 = vsubps_avx(auVar26,auVar25);
          auVar27._4_4_ = fVar198 * fVar81;
          auVar27._0_4_ = fVar196 * fVar80;
          auVar27._8_4_ = fVar200 * fVar83;
          auVar27._12_4_ = fVar176 * fVar158;
          auVar27._16_4_ = fVar178 * fVar165;
          auVar27._20_4_ = fVar180 * fVar166;
          auVar27._24_4_ = fVar182 * fVar167;
          auVar27._28_4_ = auVar161._28_4_ + auVar13._28_4_;
          auVar28._4_4_ = fVar235 * fVar169;
          auVar28._0_4_ = fVar232 * fVar168;
          auVar28._8_4_ = fVar237 * fVar170;
          auVar28._12_4_ = fVar239 * fVar186;
          auVar28._16_4_ = fVar241 * fVar190;
          auVar28._20_4_ = fVar243 * fVar192;
          auVar28._24_4_ = fVar245 * fVar194;
          auVar28._28_4_ = fVar132 + fVar77;
          auVar19 = vsubps_avx(auVar28,auVar27);
          fVar132 = auVar71._28_4_;
          local_11a0._0_4_ =
               fVar76 * auVar71._0_4_ +
               (float)local_1640._4_4_ * auVar100._0_4_ + auVar19._0_4_ * fVar66;
          local_11a0._4_4_ =
               fVar76 * auVar71._4_4_ +
               (float)local_1640._4_4_ * auVar100._4_4_ + auVar19._4_4_ * fVar66;
          local_11a0._8_4_ =
               fVar76 * auVar71._8_4_ +
               (float)local_1640._4_4_ * auVar100._8_4_ + auVar19._8_4_ * fVar66;
          local_11a0._12_4_ =
               fVar76 * auVar71._12_4_ +
               (float)local_1640._4_4_ * auVar100._12_4_ + auVar19._12_4_ * fVar66;
          local_11a0._16_4_ =
               fVar76 * auVar71._16_4_ +
               (float)local_1640._4_4_ * auVar100._16_4_ + auVar19._16_4_ * fVar66;
          local_11a0._20_4_ =
               fVar76 * auVar71._20_4_ +
               (float)local_1640._4_4_ * auVar100._20_4_ + auVar19._20_4_ * fVar66;
          local_11a0._24_4_ =
               fVar76 * auVar71._24_4_ +
               (float)local_1640._4_4_ * auVar100._24_4_ + auVar19._24_4_ * fVar66;
          local_11a0._28_4_ = fVar132 + auVar100._28_4_ + auVar19._28_4_;
          auVar71 = vsubps_avx(auVar13,auVar15);
          fVar131 = auVar13._0_4_ + auVar15._0_4_;
          fVar140 = auVar13._4_4_ + auVar15._4_4_;
          fVar141 = auVar13._8_4_ + auVar15._8_4_;
          fVar143 = auVar13._12_4_ + auVar15._12_4_;
          fVar145 = auVar13._16_4_ + auVar15._16_4_;
          fVar147 = auVar13._20_4_ + auVar15._20_4_;
          fVar149 = auVar13._24_4_ + auVar15._24_4_;
          auVar19 = vsubps_avx(auVar122,auVar101);
          fVar196 = auVar122._0_4_ + auVar101._0_4_;
          fVar198 = auVar122._4_4_ + auVar101._4_4_;
          fVar200 = auVar122._8_4_ + auVar101._8_4_;
          fVar176 = auVar122._12_4_ + auVar101._12_4_;
          fVar178 = auVar122._16_4_ + auVar101._16_4_;
          fVar180 = auVar122._20_4_ + auVar101._20_4_;
          fVar182 = auVar122._24_4_ + auVar101._24_4_;
          auVar122 = vsubps_avx(auVar14,auVar16);
          fVar168 = auVar14._0_4_ + auVar16._0_4_;
          fVar169 = auVar14._4_4_ + auVar16._4_4_;
          fVar170 = auVar14._8_4_ + auVar16._8_4_;
          fVar186 = auVar14._12_4_ + auVar16._12_4_;
          fVar190 = auVar14._16_4_ + auVar16._16_4_;
          fVar192 = auVar14._20_4_ + auVar16._20_4_;
          fVar194 = auVar14._24_4_ + auVar16._24_4_;
          fVar171 = auVar122._0_4_;
          fVar174 = auVar122._4_4_;
          auVar14._4_4_ = fVar174 * fVar198;
          auVar14._0_4_ = fVar171 * fVar196;
          fVar175 = auVar122._8_4_;
          auVar14._8_4_ = fVar175 * fVar200;
          fVar177 = auVar122._12_4_;
          auVar14._12_4_ = fVar177 * fVar176;
          fVar179 = auVar122._16_4_;
          auVar14._16_4_ = fVar179 * fVar178;
          fVar181 = auVar122._20_4_;
          auVar14._20_4_ = fVar181 * fVar180;
          fVar183 = auVar122._24_4_;
          auVar14._24_4_ = fVar183 * fVar182;
          auVar14._28_4_ = fVar77;
          fVar187 = auVar19._0_4_;
          fVar191 = auVar19._4_4_;
          auVar29._4_4_ = fVar191 * fVar169;
          auVar29._0_4_ = fVar187 * fVar168;
          fVar193 = auVar19._8_4_;
          auVar29._8_4_ = fVar193 * fVar170;
          fVar195 = auVar19._12_4_;
          auVar29._12_4_ = fVar195 * fVar186;
          fVar197 = auVar19._16_4_;
          auVar29._16_4_ = fVar197 * fVar190;
          fVar199 = auVar19._20_4_;
          auVar29._20_4_ = fVar199 * fVar192;
          fVar201 = auVar19._24_4_;
          auVar29._24_4_ = fVar201 * fVar194;
          auVar29._28_4_ = fVar132;
          auVar100 = vsubps_avx(auVar29,auVar14);
          fVar113 = auVar71._0_4_;
          fVar124 = auVar71._4_4_;
          auVar30._4_4_ = fVar124 * fVar169;
          auVar30._0_4_ = fVar113 * fVar168;
          fVar168 = auVar71._8_4_;
          auVar30._8_4_ = fVar168 * fVar170;
          fVar169 = auVar71._12_4_;
          auVar30._12_4_ = fVar169 * fVar186;
          fVar170 = auVar71._16_4_;
          auVar30._16_4_ = fVar170 * fVar190;
          fVar186 = auVar71._20_4_;
          auVar30._20_4_ = fVar186 * fVar192;
          fVar190 = auVar71._24_4_;
          auVar30._24_4_ = fVar190 * fVar194;
          auVar30._28_4_ = fVar78 + auVar16._28_4_;
          auVar16._4_4_ = fVar174 * fVar140;
          auVar16._0_4_ = fVar171 * fVar131;
          auVar16._8_4_ = fVar175 * fVar141;
          auVar16._12_4_ = fVar177 * fVar143;
          auVar16._16_4_ = fVar179 * fVar145;
          auVar16._20_4_ = fVar181 * fVar147;
          auVar16._24_4_ = fVar183 * fVar149;
          auVar16._28_4_ = fVar132;
          auVar71 = vsubps_avx(auVar16,auVar30);
          auVar31._4_4_ = fVar191 * fVar140;
          auVar31._0_4_ = fVar187 * fVar131;
          auVar31._8_4_ = fVar193 * fVar141;
          auVar31._12_4_ = fVar195 * fVar143;
          auVar31._16_4_ = fVar197 * fVar145;
          auVar31._20_4_ = fVar199 * fVar147;
          auVar31._24_4_ = fVar201 * fVar149;
          auVar31._28_4_ = auVar13._28_4_ + auVar15._28_4_;
          auVar13._4_4_ = fVar124 * fVar198;
          auVar13._0_4_ = fVar113 * fVar196;
          auVar13._8_4_ = fVar168 * fVar200;
          auVar13._12_4_ = fVar169 * fVar176;
          auVar13._16_4_ = fVar170 * fVar178;
          auVar13._20_4_ = fVar186 * fVar180;
          auVar13._24_4_ = fVar190 * fVar182;
          auVar13._28_4_ = fVar77 + auVar101._28_4_;
          auVar13 = vsubps_avx(auVar13,auVar31);
          local_1640._0_4_ = local_1640._4_4_;
          fStack_1638 = (float)local_1640._4_4_;
          fStack_1634 = (float)local_1640._4_4_;
          fStack_1630 = (float)local_1640._4_4_;
          fStack_162c = (float)local_1640._4_4_;
          fStack_1628 = (float)local_1640._4_4_;
          fStack_1624 = (float)local_1640._4_4_;
          auVar101._0_4_ =
               fVar76 * auVar100._0_4_ +
               auVar13._0_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._0_4_;
          auVar101._4_4_ =
               fVar76 * auVar100._4_4_ +
               auVar13._4_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._4_4_;
          auVar101._8_4_ =
               fVar76 * auVar100._8_4_ +
               auVar13._8_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._8_4_;
          auVar101._12_4_ =
               fVar76 * auVar100._12_4_ +
               auVar13._12_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._12_4_;
          auVar101._16_4_ =
               fVar76 * auVar100._16_4_ +
               auVar13._16_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._16_4_;
          auVar101._20_4_ =
               fVar76 * auVar100._20_4_ +
               auVar13._20_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._20_4_;
          auVar101._24_4_ =
               fVar76 * auVar100._24_4_ +
               auVar13._24_4_ * fVar66 + (float)local_1640._4_4_ * auVar71._24_4_;
          auVar101._28_4_ = auVar13._28_4_ + auVar13._28_4_ + auVar71._28_4_;
          local_1160._0_4_ = auVar101._0_4_ + local_1180._0_4_ + local_11a0._0_4_;
          local_1160._4_4_ = auVar101._4_4_ + local_1180._4_4_ + local_11a0._4_4_;
          local_1160._8_4_ = auVar101._8_4_ + local_1180._8_4_ + local_11a0._8_4_;
          local_1160._12_4_ = auVar101._12_4_ + local_1180._12_4_ + local_11a0._12_4_;
          local_1160._16_4_ = auVar101._16_4_ + local_1180._16_4_ + local_11a0._16_4_;
          local_1160._20_4_ = auVar101._20_4_ + local_1180._20_4_ + local_11a0._20_4_;
          local_1160._24_4_ = auVar101._24_4_ + local_1180._24_4_ + local_11a0._24_4_;
          local_1160._28_4_ = auVar101._28_4_ + local_1180._28_4_ + local_11a0._28_4_;
          auVar71 = vminps_avx(local_1180,local_11a0);
          auVar71 = vminps_avx(auVar71,auVar101);
          auVar137._8_4_ = 0x7fffffff;
          auVar137._0_8_ = 0x7fffffff7fffffff;
          auVar137._12_4_ = 0x7fffffff;
          auVar137._16_4_ = 0x7fffffff;
          auVar137._20_4_ = 0x7fffffff;
          auVar137._24_4_ = 0x7fffffff;
          auVar137._28_4_ = 0x7fffffff;
          local_11c0 = vandps_avx(local_1160,auVar137);
          fVar132 = local_11c0._0_4_ * 1.1920929e-07;
          fVar77 = local_11c0._4_4_ * 1.1920929e-07;
          auVar15._4_4_ = fVar77;
          auVar15._0_4_ = fVar132;
          fVar192 = local_11c0._8_4_ * 1.1920929e-07;
          auVar15._8_4_ = fVar192;
          fVar194 = local_11c0._12_4_ * 1.1920929e-07;
          auVar15._12_4_ = fVar194;
          fVar196 = local_11c0._16_4_ * 1.1920929e-07;
          auVar15._16_4_ = fVar196;
          fVar198 = local_11c0._20_4_ * 1.1920929e-07;
          auVar15._20_4_ = fVar198;
          fVar200 = local_11c0._24_4_ * 1.1920929e-07;
          auVar15._24_4_ = fVar200;
          auVar15._28_4_ = 0x34000000;
          auVar154._0_8_ = CONCAT44(fVar77,fVar132) ^ 0x8000000080000000;
          auVar154._8_4_ = -fVar192;
          auVar154._12_4_ = -fVar194;
          auVar154._16_4_ = -fVar196;
          auVar154._20_4_ = -fVar198;
          auVar154._24_4_ = -fVar200;
          auVar154._28_4_ = 0xb4000000;
          auVar71 = vcmpps_avx(auVar71,auVar154,5);
          auVar13 = vmaxps_avx(local_1180,local_11a0);
          auVar100 = vmaxps_avx(auVar13,auVar101);
          auVar100 = vcmpps_avx(auVar100,auVar15,2);
          auVar71 = vorps_avx(auVar71,auVar100);
          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar71 >> 0x7f,0) != '\0') ||
                (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar71 >> 0xbf,0) != '\0') ||
              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar71[0x1f] < '\0') {
            auVar32._4_4_ = fVar81 * fVar82;
            auVar32._0_4_ = fVar80 * fVar79;
            auVar32._8_4_ = fVar83 * fVar105;
            auVar32._12_4_ = fVar158 * fVar107;
            auVar32._16_4_ = fVar165 * fVar110;
            auVar32._20_4_ = fVar166 * fVar114;
            auVar32._24_4_ = fVar167 * fVar125;
            auVar32._28_4_ = auVar100._28_4_;
            auVar33._4_4_ = fVar217 * fVar218;
            auVar33._0_4_ = fVar213 * fVar214;
            auVar33._8_4_ = fVar219 * fVar220;
            auVar33._12_4_ = fVar221 * fVar222;
            auVar33._16_4_ = fVar223 * fVar224;
            auVar33._20_4_ = fVar225 * fVar226;
            auVar33._24_4_ = fVar227 * fVar228;
            auVar33._28_4_ = 0x34000000;
            auVar15 = vsubps_avx(auVar33,auVar32);
            auVar34._4_4_ = fVar191 * fVar218;
            auVar34._0_4_ = fVar187 * fVar214;
            auVar34._8_4_ = fVar193 * fVar220;
            auVar34._12_4_ = fVar195 * fVar222;
            auVar34._16_4_ = fVar197 * fVar224;
            auVar34._20_4_ = fVar199 * fVar226;
            auVar34._24_4_ = fVar201 * fVar228;
            auVar34._28_4_ = auVar13._28_4_;
            auVar35._4_4_ = fVar81 * fVar174;
            auVar35._0_4_ = fVar80 * fVar171;
            auVar35._8_4_ = fVar83 * fVar175;
            auVar35._12_4_ = fVar158 * fVar177;
            auVar35._16_4_ = fVar165 * fVar179;
            auVar35._20_4_ = fVar166 * fVar181;
            auVar35._24_4_ = fVar167 * fVar183;
            auVar35._28_4_ = auVar19._28_4_;
            auVar14 = vsubps_avx(auVar35,auVar34);
            auVar162._8_4_ = 0x7fffffff;
            auVar162._0_8_ = 0x7fffffff7fffffff;
            auVar162._12_4_ = 0x7fffffff;
            auVar162._16_4_ = 0x7fffffff;
            auVar162._20_4_ = 0x7fffffff;
            auVar162._24_4_ = 0x7fffffff;
            auVar162._28_4_ = 0x7fffffff;
            auVar100 = vandps_avx(auVar32,auVar162);
            auVar13 = vandps_avx(auVar34,auVar162);
            auVar100 = vcmpps_avx(auVar100,auVar13,1);
            auVar14 = vblendvps_avx(auVar14,auVar15,auVar100);
            auVar36._4_4_ = fVar235 * fVar174;
            auVar36._0_4_ = fVar232 * fVar171;
            auVar36._8_4_ = fVar237 * fVar175;
            auVar36._12_4_ = fVar239 * fVar177;
            auVar36._16_4_ = fVar241 * fVar179;
            auVar36._20_4_ = fVar243 * fVar181;
            auVar36._24_4_ = fVar245 * fVar183;
            auVar36._28_4_ = auVar15._28_4_;
            auVar37._4_4_ = fVar235 * fVar82;
            auVar37._0_4_ = fVar232 * fVar79;
            auVar37._8_4_ = fVar237 * fVar105;
            auVar37._12_4_ = fVar239 * fVar107;
            auVar37._16_4_ = fVar241 * fVar110;
            auVar37._20_4_ = fVar243 * fVar114;
            auVar37._24_4_ = fVar245 * fVar125;
            auVar37._28_4_ = auVar13._28_4_;
            auVar38._4_4_ = fVar207 * fVar218;
            auVar38._0_4_ = fVar204 * fVar214;
            auVar38._8_4_ = fVar208 * fVar220;
            auVar38._12_4_ = fVar209 * fVar222;
            auVar38._16_4_ = fVar210 * fVar224;
            auVar38._20_4_ = fVar211 * fVar226;
            auVar38._24_4_ = fVar212 * fVar228;
            auVar38._28_4_ = fVar78;
            auVar101 = vsubps_avx(auVar37,auVar38);
            auVar39._4_4_ = fVar124 * fVar218;
            auVar39._0_4_ = fVar113 * fVar214;
            auVar39._8_4_ = fVar168 * fVar220;
            auVar39._12_4_ = fVar169 * fVar222;
            auVar39._16_4_ = fVar170 * fVar224;
            auVar39._20_4_ = fVar186 * fVar226;
            auVar39._24_4_ = fVar190 * fVar228;
            auVar39._28_4_ = local_1120._28_4_;
            auVar16 = vsubps_avx(auVar39,auVar36);
            auVar100 = vandps_avx(auVar38,auVar162);
            auVar13 = vandps_avx(auVar36,auVar162);
            auVar100 = vcmpps_avx(auVar100,auVar13,1);
            auVar15 = vblendvps_avx(auVar16,auVar101,auVar100);
            auVar40._4_4_ = fVar81 * fVar124;
            auVar40._0_4_ = fVar80 * fVar113;
            auVar40._8_4_ = fVar83 * fVar168;
            auVar40._12_4_ = fVar158 * fVar169;
            auVar40._16_4_ = fVar165 * fVar170;
            auVar40._20_4_ = fVar166 * fVar186;
            auVar40._24_4_ = fVar167 * fVar190;
            auVar40._28_4_ = auVar16._28_4_;
            auVar41._4_4_ = fVar207 * fVar81;
            auVar41._0_4_ = fVar204 * fVar80;
            auVar41._8_4_ = fVar208 * fVar83;
            auVar41._12_4_ = fVar209 * fVar158;
            auVar41._16_4_ = fVar210 * fVar165;
            auVar41._20_4_ = fVar211 * fVar166;
            auVar41._24_4_ = fVar212 * fVar167;
            auVar41._28_4_ = auVar100._28_4_;
            auVar42._4_4_ = fVar235 * fVar217;
            auVar42._0_4_ = fVar232 * fVar213;
            auVar42._8_4_ = fVar237 * fVar219;
            auVar42._12_4_ = fVar239 * fVar221;
            auVar42._16_4_ = fVar241 * fVar223;
            auVar42._20_4_ = fVar243 * fVar225;
            auVar42._24_4_ = fVar245 * fVar227;
            auVar42._28_4_ = auVar101._28_4_;
            auVar43._4_4_ = fVar235 * fVar191;
            auVar43._0_4_ = fVar232 * fVar187;
            auVar43._8_4_ = fVar237 * fVar193;
            auVar43._12_4_ = fVar239 * fVar195;
            auVar43._16_4_ = fVar241 * fVar197;
            auVar43._20_4_ = fVar243 * fVar199;
            auVar43._24_4_ = fVar245 * fVar201;
            auVar43._28_4_ = local_1140._28_4_;
            auVar101 = vsubps_avx(auVar41,auVar42);
            auVar16 = vsubps_avx(auVar43,auVar40);
            auVar100 = vandps_avx(auVar42,auVar162);
            auVar13 = vandps_avx(auVar40,auVar162);
            auVar100 = vcmpps_avx(auVar100,auVar13,1);
            auVar100 = vblendvps_avx(auVar16,auVar101,auVar100);
            auVar69 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
            fVar114 = auVar100._0_4_;
            fVar166 = auVar100._4_4_;
            fVar125 = auVar100._8_4_;
            fVar167 = auVar100._12_4_;
            fVar168 = auVar100._16_4_;
            fVar169 = auVar100._20_4_;
            fVar170 = auVar100._24_4_;
            fVar186 = auVar15._0_4_;
            fVar190 = auVar15._4_4_;
            fVar192 = auVar15._8_4_;
            fVar194 = auVar15._12_4_;
            fVar196 = auVar15._16_4_;
            fVar198 = auVar15._20_4_;
            fVar200 = auVar15._24_4_;
            fVar81 = auVar14._0_4_;
            fVar105 = auVar14._4_4_;
            fVar83 = auVar14._8_4_;
            fVar107 = auVar14._12_4_;
            fVar158 = auVar14._16_4_;
            fVar110 = auVar14._20_4_;
            fVar165 = auVar14._24_4_;
            fVar132 = fVar81 * fVar76 + fVar114 * fVar66 + fVar186 * (float)local_1640._4_4_;
            fVar77 = fVar105 * fVar76 + fVar166 * fVar66 + fVar190 * (float)local_1640._4_4_;
            fVar78 = fVar83 * fVar76 + fVar125 * fVar66 + fVar192 * (float)local_1640._4_4_;
            fVar79 = fVar107 * fVar76 + fVar167 * fVar66 + fVar194 * (float)local_1640._4_4_;
            fVar80 = fVar158 * fVar76 + fVar168 * fVar66 + fVar196 * (float)local_1640._4_4_;
            fVar82 = fVar110 * fVar76 + fVar169 * fVar66 + fVar198 * (float)local_1640._4_4_;
            fVar66 = fVar165 * fVar76 + fVar170 * fVar66 + fVar200 * (float)local_1640._4_4_;
            fVar76 = auVar101._28_4_ + auVar101._28_4_ + 0.0;
            auVar73._0_4_ = fVar132 + fVar132;
            auVar73._4_4_ = fVar77 + fVar77;
            auVar73._8_4_ = fVar78 + fVar78;
            auVar73._12_4_ = fVar79 + fVar79;
            auVar73._16_4_ = fVar80 + fVar80;
            auVar73._20_4_ = fVar82 + fVar82;
            auVar73._24_4_ = fVar66 + fVar66;
            auVar73._28_4_ = fVar76 + fVar76;
            fVar132 = fVar81 * fVar108 + fVar114 * fVar231 + fVar186 * fVar106;
            fVar77 = fVar105 * fVar111 + fVar166 * fVar234 + fVar190 * fVar109;
            fVar142 = fVar83 * fVar142 + fVar125 * fVar236 + fVar192 * fVar112;
            fVar144 = fVar107 * fVar146 + fVar167 * fVar238 + fVar194 * fVar144;
            fVar146 = fVar158 * fVar150 + fVar168 * fVar240 + fVar196 * fVar148;
            fVar148 = fVar110 * fVar10 + fVar169 * fVar242 + fVar198 * fVar9;
            fVar150 = fVar165 * fVar12 + fVar170 * fVar244 + fVar200 * fVar11;
            auVar71 = vrcpps_avx(auVar73);
            fVar66 = auVar71._0_4_;
            fVar76 = auVar71._4_4_;
            auVar44._4_4_ = auVar73._4_4_ * fVar76;
            auVar44._0_4_ = auVar73._0_4_ * fVar66;
            fVar106 = auVar71._8_4_;
            auVar44._8_4_ = auVar73._8_4_ * fVar106;
            fVar108 = auVar71._12_4_;
            auVar44._12_4_ = auVar73._12_4_ * fVar108;
            fVar109 = auVar71._16_4_;
            auVar44._16_4_ = auVar73._16_4_ * fVar109;
            fVar111 = auVar71._20_4_;
            auVar44._20_4_ = auVar73._20_4_ * fVar111;
            fVar112 = auVar71._24_4_;
            auVar44._24_4_ = auVar73._24_4_ * fVar112;
            auVar44._28_4_ = auVar122._28_4_;
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = 0x3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar163._16_4_ = 0x3f800000;
            auVar163._20_4_ = 0x3f800000;
            auVar163._24_4_ = 0x3f800000;
            auVar163._28_4_ = 0x3f800000;
            auVar71 = vsubps_avx(auVar163,auVar44);
            local_14a0._4_4_ = (fVar77 + fVar77) * (auVar71._4_4_ * fVar76 + fVar76);
            local_14a0._0_4_ = (fVar132 + fVar132) * (auVar71._0_4_ * fVar66 + fVar66);
            local_14a0._8_4_ = (fVar142 + fVar142) * (auVar71._8_4_ * fVar106 + fVar106);
            local_14a0._12_4_ = (fVar144 + fVar144) * (auVar71._12_4_ * fVar108 + fVar108);
            local_14a0._16_4_ = (fVar146 + fVar146) * (auVar71._16_4_ * fVar109 + fVar109);
            local_14a0._20_4_ = (fVar148 + fVar148) * (auVar71._20_4_ * fVar111 + fVar111);
            local_14a0._24_4_ = (fVar150 + fVar150) * (auVar71._24_4_ * fVar112 + fVar112);
            local_14a0._28_4_ = local_10e0._28_4_;
            auVar130 = ZEXT3264(local_14a0);
            uVar53 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar138._4_4_ = uVar53;
            auVar138._0_4_ = uVar53;
            auVar138._8_4_ = uVar53;
            auVar138._12_4_ = uVar53;
            auVar138._16_4_ = uVar53;
            auVar138._20_4_ = uVar53;
            auVar138._24_4_ = uVar53;
            auVar138._28_4_ = uVar53;
            auVar71 = vcmpps_avx(auVar138,local_14a0,2);
            auVar67 = vpermilps_avx(ZEXT416((uint)*(float *)(ray + k * 4 + 0x100)),0);
            auVar155._16_16_ = auVar67;
            auVar155._0_16_ = auVar67;
            auVar100 = vcmpps_avx(local_14a0,auVar155,2);
            auVar71 = vandps_avx(auVar100,auVar71);
            auVar67 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
            auVar69 = vpand_avx(auVar67,auVar69);
            auVar67 = vpmovsxwd_avx(auVar69);
            auVar84 = vpshufd_avx(auVar69,0xee);
            auVar84 = vpmovsxwd_avx(auVar84);
            auVar139._16_16_ = auVar84;
            auVar139._0_16_ = auVar67;
            if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar139 >> 0x7f,0) != '\0') ||
                  (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar84 >> 0x3f,0) != '\0') ||
                (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar84[0xf] < '\0') {
              auVar71 = vcmpps_avx(auVar73,_DAT_01f7b000,4);
              auVar67 = vpackssdw_avx(auVar71._0_16_,auVar71._16_16_);
              auVar69 = vpand_avx(auVar69,auVar67);
              auVar67 = vpmovsxwd_avx(auVar69);
              auVar69 = vpunpckhwd_avx(auVar69,auVar69);
              local_12e0._16_16_ = auVar69;
              local_12e0._0_16_ = auVar67;
              if ((((((((local_12e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_12e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_12e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_12e0 >> 0x7f,0) != '\0') ||
                    (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar69 >> 0x3f,0) != '\0') ||
                  (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar69[0xf] < '\0') {
                local_1320 = local_1160;
                local_1300 = &local_1661;
                local_1280 = local_14a0;
                auVar71 = vsubps_avx(local_1160,local_11a0);
                auVar71 = vblendvps_avx(local_1180,auVar71,local_11e0);
                auVar100 = vsubps_avx(local_1160,local_1180);
                local_1340 = vblendvps_avx(local_11a0,auVar100,local_11e0);
                uStack_1244 = auVar14._28_4_;
                local_1260[0] = (float)local_1200._0_4_ * fVar81;
                local_1260[1] = (float)local_1200._4_4_ * fVar105;
                local_1260[2] = fStack_11f8 * fVar83;
                local_1260[3] = fStack_11f4 * fVar107;
                fStack_1250 = fStack_11f0 * fVar158;
                fStack_124c = fStack_11ec * fVar110;
                fStack_1248 = fStack_11e8 * fVar165;
                local_1240[0] = fVar186 * (float)local_1200._0_4_;
                local_1240[1] = fVar190 * (float)local_1200._4_4_;
                local_1240[2] = fVar192 * fStack_11f8;
                local_1240[3] = fVar194 * fStack_11f4;
                fStack_1230 = fVar196 * fStack_11f0;
                fStack_122c = fVar198 * fStack_11ec;
                fStack_1228 = fVar200 * fStack_11e8;
                uStack_1224 = uStack_1244;
                local_1220[0] = (float)local_1200._0_4_ * fVar114;
                local_1220[1] = (float)local_1200._4_4_ * fVar166;
                local_1220[2] = fStack_11f8 * fVar125;
                local_1220[3] = fStack_11f4 * fVar167;
                fStack_1210 = fStack_11f0 * fVar168;
                fStack_120c = fStack_11ec * fVar169;
                fStack_1208 = fStack_11e8 * fVar170;
                uStack_1204 = uStack_1244;
                auVar121._0_4_ = (float)(int)(*(ushort *)(local_1588 + 8 + lVar59) - 1);
                auVar121._4_12_ = auVar18._4_12_;
                auVar84 = vpshufd_avx(ZEXT416(local_164c),0);
                auVar84 = vpaddd_avx(auVar84,_DAT_01f76ad0);
                auVar85 = vrcpss_avx(auVar121,auVar121);
                auVar102._16_16_ = auVar84;
                auVar102._0_16_ = auVar84;
                auVar100 = vcvtdq2ps_avx(auVar102);
                fVar142 = auVar71._28_4_ + auVar100._28_4_;
                auVar84 = ZEXT416((uint)(auVar85._0_4_ * (2.0 - auVar85._0_4_ * auVar121._0_4_)));
                auVar84 = vshufps_avx(auVar84,auVar84,0);
                fVar66 = (auVar71._0_4_ + local_1160._0_4_ * auVar100._0_4_) * auVar84._0_4_;
                fVar76 = (auVar71._4_4_ + local_1160._4_4_ * auVar100._4_4_) * auVar84._4_4_;
                local_1360._4_4_ = fVar76;
                local_1360._0_4_ = fVar66;
                fVar106 = (auVar71._8_4_ + local_1160._8_4_ * auVar100._8_4_) * auVar84._8_4_;
                local_1360._8_4_ = fVar106;
                fVar108 = (auVar71._12_4_ + local_1160._12_4_ * auVar100._12_4_) * auVar84._12_4_;
                local_1360._12_4_ = fVar108;
                fVar109 = (auVar71._16_4_ + local_1160._16_4_ * auVar100._16_4_) * auVar84._0_4_;
                local_1360._16_4_ = fVar109;
                fVar111 = (auVar71._20_4_ + local_1160._20_4_ * auVar100._20_4_) * auVar84._4_4_;
                local_1360._20_4_ = fVar111;
                fVar112 = (auVar71._24_4_ + local_1160._24_4_ * auVar100._24_4_) * auVar84._8_4_;
                local_1360._24_4_ = fVar112;
                local_1360._28_4_ = fVar142;
                pGVar7 = (local_1580->geometries).items[uVar52].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar84 = vpshufd_avx(ZEXT416(local_1650),0);
                  auVar84 = vpaddd_avx(auVar84,_DAT_01f76ae0);
                  auVar123._16_16_ = auVar84;
                  auVar123._0_16_ = auVar84;
                  auVar100 = vcvtdq2ps_avx(auVar123);
                  auVar160._0_4_ = (float)(int)(*(ushort *)(local_1588 + 10 + lVar59) - 1);
                  auVar160._4_12_ = auVar17._4_12_;
                  auVar84 = vrcpss_avx(auVar160,auVar160);
                  auVar84 = ZEXT416((uint)(auVar84._0_4_ * (2.0 - auVar84._0_4_ * auVar160._0_4_)));
                  auVar84 = vshufps_avx(auVar84,auVar84,0);
                  auVar71 = vrcpps_avx(local_1160);
                  fVar144 = auVar71._0_4_;
                  fVar146 = auVar71._4_4_;
                  auVar45._4_4_ = local_1160._4_4_ * fVar146;
                  auVar45._0_4_ = local_1160._0_4_ * fVar144;
                  fVar148 = auVar71._8_4_;
                  auVar45._8_4_ = local_1160._8_4_ * fVar148;
                  fVar150 = auVar71._12_4_;
                  auVar45._12_4_ = local_1160._12_4_ * fVar150;
                  fVar9 = auVar71._16_4_;
                  auVar45._16_4_ = local_1160._16_4_ * fVar9;
                  fVar10 = auVar71._20_4_;
                  auVar45._20_4_ = local_1160._20_4_ * fVar10;
                  fVar11 = auVar71._24_4_;
                  auVar45._24_4_ = local_1160._24_4_ * fVar11;
                  auVar45._28_4_ = local_1160._28_4_;
                  auVar164._8_4_ = 0x3f800000;
                  auVar164._0_8_ = 0x3f8000003f800000;
                  auVar164._12_4_ = 0x3f800000;
                  auVar164._16_4_ = 0x3f800000;
                  auVar164._20_4_ = 0x3f800000;
                  auVar164._24_4_ = 0x3f800000;
                  auVar164._28_4_ = 0x3f800000;
                  auVar13 = vsubps_avx(auVar164,auVar45);
                  auVar91._0_4_ = fVar144 + fVar144 * auVar13._0_4_;
                  auVar91._4_4_ = fVar146 + fVar146 * auVar13._4_4_;
                  auVar91._8_4_ = fVar148 + fVar148 * auVar13._8_4_;
                  auVar91._12_4_ = fVar150 + fVar150 * auVar13._12_4_;
                  auVar91._16_4_ = fVar9 + fVar9 * auVar13._16_4_;
                  auVar91._20_4_ = fVar10 + fVar10 * auVar13._20_4_;
                  auVar91._24_4_ = fVar11 + fVar11 * auVar13._24_4_;
                  auVar91._28_4_ = auVar71._28_4_ + auVar13._28_4_;
                  auVar156._8_4_ = 0x219392ef;
                  auVar156._0_8_ = 0x219392ef219392ef;
                  auVar156._12_4_ = 0x219392ef;
                  auVar156._16_4_ = 0x219392ef;
                  auVar156._20_4_ = 0x219392ef;
                  auVar156._24_4_ = 0x219392ef;
                  auVar156._28_4_ = 0x219392ef;
                  auVar71 = vcmpps_avx(local_11c0,auVar156,5);
                  auVar71 = vandps_avx(auVar71,auVar91);
                  auVar46._4_4_ = fVar76 * auVar71._4_4_;
                  auVar46._0_4_ = fVar66 * auVar71._0_4_;
                  auVar46._8_4_ = fVar106 * auVar71._8_4_;
                  auVar46._12_4_ = fVar108 * auVar71._12_4_;
                  auVar46._16_4_ = fVar109 * auVar71._16_4_;
                  auVar46._20_4_ = fVar111 * auVar71._20_4_;
                  auVar46._24_4_ = fVar112 * auVar71._24_4_;
                  auVar46._28_4_ = fVar142;
                  local_12c0 = vminps_avx(auVar46,auVar164);
                  auVar47._4_4_ =
                       (local_1160._4_4_ * auVar100._4_4_ + local_1340._4_4_) * auVar84._4_4_ *
                       auVar71._4_4_;
                  auVar47._0_4_ =
                       (local_1160._0_4_ * auVar100._0_4_ + local_1340._0_4_) * auVar84._0_4_ *
                       auVar71._0_4_;
                  auVar47._8_4_ =
                       (local_1160._8_4_ * auVar100._8_4_ + local_1340._8_4_) * auVar84._8_4_ *
                       auVar71._8_4_;
                  auVar47._12_4_ =
                       (local_1160._12_4_ * auVar100._12_4_ + local_1340._12_4_) * auVar84._12_4_ *
                       auVar71._12_4_;
                  auVar47._16_4_ =
                       (local_1160._16_4_ * auVar100._16_4_ + local_1340._16_4_) * auVar84._0_4_ *
                       auVar71._16_4_;
                  auVar47._20_4_ =
                       (local_1160._20_4_ * auVar100._20_4_ + local_1340._20_4_) * auVar84._4_4_ *
                       auVar71._20_4_;
                  auVar47._24_4_ =
                       (local_1160._24_4_ * auVar100._24_4_ + local_1340._24_4_) * auVar84._8_4_ *
                       auVar71._24_4_;
                  auVar47._28_4_ = auVar71._28_4_;
                  local_12a0 = vminps_avx(auVar47,auVar164);
                  auVar92._16_16_ = auVar69;
                  auVar92._0_16_ = auVar67;
                  auVar103._8_4_ = 0x7f800000;
                  auVar103._0_8_ = 0x7f8000007f800000;
                  auVar103._12_4_ = 0x7f800000;
                  auVar103._16_4_ = 0x7f800000;
                  auVar103._20_4_ = 0x7f800000;
                  auVar103._24_4_ = 0x7f800000;
                  auVar103._28_4_ = 0x7f800000;
                  auVar71 = vblendvps_avx(auVar103,local_14a0,auVar92);
                  auVar100 = vshufps_avx(auVar71,auVar71,0xb1);
                  auVar100 = vminps_avx(auVar71,auVar100);
                  auVar13 = vshufpd_avx(auVar100,auVar100,5);
                  auVar100 = vminps_avx(auVar100,auVar13);
                  auVar13 = vperm2f128_avx(auVar100,auVar100,1);
                  auVar100 = vminps_avx(auVar100,auVar13);
                  auVar100 = vcmpps_avx(auVar71,auVar100,0);
                  auVar13 = local_12e0 & auVar100;
                  auVar71 = local_12e0;
                  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar13 >> 0x7f,0) != '\0') ||
                        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar13 >> 0xbf,0) != '\0') ||
                      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar13[0x1f] < '\0') {
                    auVar71 = vandps_avx(auVar100,local_12e0);
                  }
                  auVar100 = vcmpps_avx(ZEXT1632(auVar69),ZEXT1632(auVar69),0xf);
                  auVar157 = ZEXT3264(auVar100);
                  uVar49 = vmovmskps_avx(auVar71);
                  uVar5 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  uVar55 = (ulong)uVar5;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar53 = *(undefined4 *)(local_12c0 + uVar55 * 4);
                    uVar2 = *(undefined4 *)(local_12a0 + uVar55 * 4);
                    fVar66 = local_1260[uVar55];
                    fVar76 = local_1240[uVar55];
                    fVar106 = local_1220[uVar55];
                    *(float *)(ray + k * 4 + 0x100) = local_1260[uVar55 - 8];
                    *(float *)(ray + k * 4 + 0x180) = fVar66;
                    *(float *)(ray + k * 4 + 0x1a0) = fVar76;
                    *(float *)(ray + k * 4 + 0x1c0) = fVar106;
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar53;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                    *(uint *)(ray + k * 4 + 0x220) = uVar50;
                    *(uint *)(ray + k * 4 + 0x240) = uVar52;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    auVar69 = vpshufd_avx(ZEXT416(uVar52),0);
                    local_1520._16_16_ = auVar69;
                    local_1520._0_16_ = auVar69;
                    auVar69 = vshufps_avx(ZEXT416(uVar50),ZEXT416(uVar50),0);
                    local_1540._16_16_ = auVar69;
                    local_1540._0_16_ = auVar69;
                    local_1440 = *(undefined8 *)*local_1600;
                    uStack_1438 = *(undefined8 *)(*local_1600 + 8);
                    uStack_1430 = 0;
                    uStack_1428 = 0;
                    local_1460 = auVar161._0_16_;
                    uStack_1450 = *(undefined8 *)(local_1608 + 0x10);
                    uStack_1448 = *(undefined8 *)(local_1608 + 0x18);
                    uStack_1470 = *(undefined8 *)(local_1608 + 0x10);
                    local_1480 = *local_1600;
                    uStack_1468 = *(undefined8 *)(local_1608 + 0x18);
                    auVar173 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    local_1420 = local_12e0;
                    local_1120 = auVar72;
                    local_10e0 = auVar20;
                    while( true ) {
                      local_1060 = *(undefined4 *)(local_12c0 + uVar55 * 4);
                      local_1040 = *(undefined4 *)(local_12a0 + uVar55 * 4);
                      *(float *)(ray + k * 4 + 0x100) = local_1260[uVar55 - 8];
                      local_10c0 = local_1260[uVar55];
                      local_10a0 = local_1240[uVar55];
                      fVar66 = local_1220[uVar55];
                      local_1080._4_4_ = fVar66;
                      local_1080._0_4_ = fVar66;
                      local_1080._8_4_ = fVar66;
                      local_1080._12_4_ = fVar66;
                      local_1080._16_4_ = fVar66;
                      local_1080._20_4_ = fVar66;
                      local_1080._24_4_ = fVar66;
                      local_1080._28_4_ = fVar66;
                      local_1570.context = context->user;
                      fStack_10bc = local_10c0;
                      fStack_10b8 = local_10c0;
                      fStack_10b4 = local_10c0;
                      fStack_10b0 = local_10c0;
                      fStack_10ac = local_10c0;
                      fStack_10a8 = local_10c0;
                      fStack_10a4 = local_10c0;
                      fStack_109c = local_10a0;
                      fStack_1098 = local_10a0;
                      fStack_1094 = local_10a0;
                      fStack_1090 = local_10a0;
                      fStack_108c = local_10a0;
                      fStack_1088 = local_10a0;
                      fStack_1084 = local_10a0;
                      uStack_105c = local_1060;
                      uStack_1058 = local_1060;
                      uStack_1054 = local_1060;
                      uStack_1050 = local_1060;
                      uStack_104c = local_1060;
                      uStack_1048 = local_1060;
                      uStack_1044 = local_1060;
                      uStack_103c = local_1040;
                      uStack_1038 = local_1040;
                      uStack_1034 = local_1040;
                      uStack_1030 = local_1040;
                      uStack_102c = local_1040;
                      uStack_1028 = local_1040;
                      uStack_1024 = local_1040;
                      local_1020 = local_1540._0_8_;
                      uStack_1018 = local_1540._8_8_;
                      uStack_1010 = local_1540._16_8_;
                      uStack_1008 = local_1540._24_8_;
                      local_1000 = local_1520._0_8_;
                      uStack_ff8 = local_1520._8_8_;
                      uStack_ff0 = local_1520._16_8_;
                      uStack_fe8 = local_1520._24_8_;
                      uStack_fdc = (local_1570.context)->instID[0];
                      local_fe0 = uStack_fdc;
                      uStack_fd8 = uStack_fdc;
                      uStack_fd4 = uStack_fdc;
                      uStack_fd0 = uStack_fdc;
                      uStack_fcc = uStack_fdc;
                      uStack_fc8 = uStack_fdc;
                      uStack_fc4 = uStack_fdc;
                      uStack_fbc = (local_1570.context)->instPrimID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = uStack_fbc;
                      uStack_fac = uStack_fbc;
                      uStack_fa8 = uStack_fbc;
                      uStack_fa4 = uStack_fbc;
                      local_1500 = local_1480._0_8_;
                      uStack_14f8 = local_1480._8_8_;
                      uStack_14f0 = uStack_1470;
                      uStack_14e8 = uStack_1468;
                      local_1570.valid = (int *)&local_1500;
                      local_1570.geometryUserPtr = pGVar7->userPtr;
                      local_1570.hit = (RTCHitN *)&local_10c0;
                      local_1570.N = 8;
                      auVar90._8_8_ = uStack_1438;
                      auVar90._0_8_ = local_1440;
                      auVar70 = local_1460;
                      local_1570.ray = (RTCRayN *)ray;
                      if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        _local_1640 = auVar173._0_16_;
                        auVar71 = ZEXT1632(auVar157._0_16_);
                        (*pGVar7->intersectionFilterN)(&local_1570);
                        auVar173 = ZEXT1664(_local_1640);
                        auVar130 = ZEXT3264(local_14a0);
                        auVar71 = vcmpps_avx(auVar71,auVar71,0xf);
                        auVar157 = ZEXT3264(auVar71);
                        auVar90._8_8_ = uStack_14f8;
                        auVar90._0_8_ = local_1500;
                        auVar70._8_8_ = uStack_14e8;
                        auVar70._0_8_ = uStack_14f0;
                      }
                      auVar69 = vpcmpeqd_avx(auVar90,ZEXT816(0) << 0x40);
                      auVar67 = vpcmpeqd_avx(auVar70,ZEXT816(0) << 0x40);
                      auVar104._16_16_ = auVar67;
                      auVar104._0_16_ = auVar69;
                      auVar71 = auVar157._0_32_ & ~auVar104;
                      if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar71 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar71 >> 0x7f,0) == '\0') &&
                            (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar71 >> 0xbf,0) == '\0') &&
                          (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar71[0x1f]) {
                        auVar74._0_4_ = auVar69._0_4_ ^ auVar157._0_4_;
                        auVar74._4_4_ = auVar69._4_4_ ^ auVar157._4_4_;
                        auVar74._8_4_ = auVar69._8_4_ ^ auVar157._8_4_;
                        auVar74._12_4_ = auVar69._12_4_ ^ auVar157._12_4_;
                        auVar74._16_4_ = auVar67._0_4_ ^ auVar157._16_4_;
                        auVar74._20_4_ = auVar67._4_4_ ^ auVar157._20_4_;
                        auVar74._24_4_ = auVar67._8_4_ ^ auVar157._24_4_;
                        auVar74._28_4_ = auVar67._12_4_ ^ auVar157._28_4_;
                      }
                      else {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          _local_1640 = auVar173._0_16_;
                          auVar71 = ZEXT1632(auVar157._0_16_);
                          (*p_Var8)(&local_1570);
                          auVar173 = ZEXT1664(_local_1640);
                          auVar130 = ZEXT3264(local_14a0);
                          auVar71 = vcmpps_avx(auVar71,auVar71,0xf);
                          auVar157 = ZEXT3264(auVar71);
                          auVar90._8_8_ = uStack_14f8;
                          auVar90._0_8_ = local_1500;
                          auVar70._8_8_ = uStack_14e8;
                          auVar70._0_8_ = uStack_14f0;
                        }
                        auVar69 = vpcmpeqd_avx(auVar90,ZEXT816(0) << 0x40);
                        auVar67 = vpcmpeqd_avx(auVar70,ZEXT816(0) << 0x40);
                        auVar93._16_16_ = auVar67;
                        auVar93._0_16_ = auVar69;
                        auVar74._0_4_ = auVar69._0_4_ ^ auVar157._0_4_;
                        auVar74._4_4_ = auVar69._4_4_ ^ auVar157._4_4_;
                        auVar74._8_4_ = auVar69._8_4_ ^ auVar157._8_4_;
                        auVar74._12_4_ = auVar69._12_4_ ^ auVar157._12_4_;
                        auVar74._16_4_ = auVar67._0_4_ ^ auVar157._16_4_;
                        auVar74._20_4_ = auVar67._4_4_ ^ auVar157._20_4_;
                        auVar74._24_4_ = auVar67._8_4_ ^ auVar157._24_4_;
                        auVar74._28_4_ = auVar67._12_4_ ^ auVar157._28_4_;
                        auVar71 = auVar157._0_32_ & ~auVar93;
                        if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar71 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar71 >> 0x7f,0) != '\0') ||
                              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar71 >> 0xbf,0) != '\0') ||
                            (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar71[0x1f] < '\0') {
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])local_1570.hit);
                          *(undefined1 (*) [32])(local_1570.ray + 0x180) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0x20));
                          *(undefined1 (*) [32])(local_1570.ray + 0x1a0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0x40));
                          *(undefined1 (*) [32])(local_1570.ray + 0x1c0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0x60));
                          *(undefined1 (*) [32])(local_1570.ray + 0x1e0) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0x80));
                          *(undefined1 (*) [32])(local_1570.ray + 0x200) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0xa0));
                          *(undefined1 (*) [32])(local_1570.ray + 0x220) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0xc0));
                          *(undefined1 (*) [32])(local_1570.ray + 0x240) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0xe0));
                          *(undefined1 (*) [32])(local_1570.ray + 0x260) = auVar71;
                          auVar71 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                                            (local_1570.hit + 0x100));
                          *(undefined1 (*) [32])(local_1570.ray + 0x280) = auVar71;
                        }
                      }
                      if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar74 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar74 >> 0x7f,0) == '\0') &&
                            (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar74 >> 0xbf,0) == '\0') &&
                          (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar74[0x1f]) {
                        *(int *)(ray + k * 4 + 0x100) = auVar173._0_4_;
                      }
                      else {
                        auVar173 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      *(undefined4 *)(local_1420 + uVar55 * 4) = 0;
                      auVar69 = vshufps_avx(auVar173._0_16_,auVar173._0_16_,0);
                      auVar75._16_16_ = auVar69;
                      auVar75._0_16_ = auVar69;
                      auVar100 = vcmpps_avx(auVar130._0_32_,auVar75,2);
                      auVar71 = vandps_avx(auVar100,local_1420);
                      local_1420 = local_1420 & auVar100;
                      if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (local_1420 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(local_1420 >> 0x7f,0) == '\0')
                            && (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                            ) && SUB321(local_1420 >> 0xbf,0) == '\0') &&
                          (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_1420[0x1f]) break;
                      auVar94._8_4_ = 0x7f800000;
                      auVar94._0_8_ = 0x7f8000007f800000;
                      auVar94._12_4_ = 0x7f800000;
                      auVar94._16_4_ = 0x7f800000;
                      auVar94._20_4_ = 0x7f800000;
                      auVar94._24_4_ = 0x7f800000;
                      auVar94._28_4_ = 0x7f800000;
                      auVar100 = vblendvps_avx(auVar94,auVar130._0_32_,auVar71);
                      auVar13 = vshufps_avx(auVar100,auVar100,0xb1);
                      auVar13 = vminps_avx(auVar100,auVar13);
                      auVar161 = vshufpd_avx(auVar13,auVar13,5);
                      auVar13 = vminps_avx(auVar13,auVar161);
                      auVar161 = vperm2f128_avx(auVar13,auVar13,1);
                      auVar13 = vminps_avx(auVar13,auVar161);
                      auVar13 = vcmpps_avx(auVar100,auVar13,0);
                      auVar161 = auVar71 & auVar13;
                      auVar100 = auVar71;
                      if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar161 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar161 >> 0x7f,0) != '\0') ||
                            (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar161 >> 0xbf,0) != '\0') ||
                          (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar161[0x1f] < '\0') {
                        auVar100 = vandps_avx(auVar13,auVar71);
                      }
                      uVar50 = vmovmskps_avx(auVar100);
                      uVar52 = 0;
                      if (uVar50 != 0) {
                        for (; (uVar50 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar55 = (ulong)uVar52;
                      local_1420 = auVar71;
                    }
                  }
                }
              }
            }
          }
          auVar189 = ZEXT1664(local_1380);
          auVar216 = ZEXT1664(local_1390);
          auVar230 = ZEXT1664(local_13a0);
          auVar233 = ZEXT1664(local_13b0);
          auVar203 = ZEXT1664(local_14b0);
          auVar206 = ZEXT1664(local_14c0);
          uVar55 = local_1658;
          uVar58 = local_1660;
          pauVar60 = local_1598;
          uVar57 = local_15a0;
          uVar61 = local_15a8;
          uVar62 = local_15b0;
          uVar63 = local_15b8;
        }
      }
      auVar157 = ZEXT1664(local_13c0);
      auVar130 = ZEXT1664(local_13d0);
      auVar173 = ZEXT1664(local_13e0);
      auVar185 = ZEXT1664(local_13f0);
    }
    uVar53 = *(undefined4 *)(ray + k * 4 + 0x100);
    local_14d0._4_4_ = uVar53;
    local_14d0._0_4_ = uVar53;
    local_14d0._8_4_ = uVar53;
    local_14d0._12_4_ = uVar53;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }